

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatictext.cpp
# Opt level: O0

int __thiscall QStaticTextPrivate::init(QStaticTextPrivate *this,EVP_PKEY_CTX *ctx)

{
  QStaticTextUserData *pQVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  QStaticTextItem *pQVar5;
  qsizetype qVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  glyph_t *pgVar10;
  const_pointer __src;
  QFixedPoint *pQVar11;
  const_pointer __src_00;
  ulong uVar12;
  long in_FS_OFFSET;
  int i;
  QList<unsigned_int> glyphs;
  QList<QFixedPoint> positions;
  QList<QStaticTextItem> deviceItems;
  QPainter painter;
  DrawTextItemDevice device;
  QStaticTextItem *in_stack_fffffffffffffe98;
  QStaticTextItem *in_stack_fffffffffffffea0;
  QStaticTextItem *pQVar13;
  QPaintDevice *in_stack_fffffffffffffea8;
  DrawTextItemDevice *in_stack_fffffffffffffeb0;
  QPainter *in_stack_fffffffffffffeb8;
  QFixedPoint *pQVar14;
  undefined8 in_stack_fffffffffffffec0;
  QColor *in_stack_fffffffffffffec8;
  QColor *in_stack_fffffffffffffed0;
  QPointF *in_stack_fffffffffffffed8;
  QStaticTextPrivate *in_stack_fffffffffffffee0;
  QFixedPoint *pQVar15;
  QStaticTextItem *local_108;
  int local_ac;
  QList<unsigned_int> local_a0;
  QList<QFixedPoint> local_88;
  QList<QStaticTextItem> local_70;
  QPointF local_58;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QPointF local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = this->items;
  if (pQVar13 != (QStaticTextItem *)0x0) {
    pQVar1 = pQVar13[-1].m_userData.d.ptr;
    for (pQVar5 = pQVar13 + (long)pQVar1; pQVar13 != pQVar5; pQVar5 = pQVar5 + -1) {
      QStaticTextItem::~QStaticTextItem(in_stack_fffffffffffffea0);
    }
    operator_delete__(&pQVar13[-1].m_userData,(long)pQVar1 * 0x50 + 8);
  }
  if (this->glyphPool != (glyph_t *)0x0) {
    operator_delete__(this->glyphPool);
  }
  if (this->positionPool != (QFixedPoint *)0x0) {
    operator_delete__(this->positionPool);
  }
  QPointF::QPointF(local_28,0.0,0.0);
  (this->position).xp = local_28[0].xp;
  (this->position).yp = local_28[0].yp;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1247ced::DrawTextItemDevice::DrawTextItemDevice
            (in_stack_fffffffffffffeb0,SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x30,0));
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  QPainter::setFont(in_stack_fffffffffffffeb8,(QFont *)in_stack_fffffffffffffeb0);
  QPainter::setTransform
            ((QPainter *)in_stack_fffffffffffffea0,(QTransform *)in_stack_fffffffffffffe98,false);
  QPointF::QPointF(&local_58,0.0,0.0);
  QColor::QColor(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (int)in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                 (int)in_stack_fffffffffffffec0);
  paintText(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
            (QPainter *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  QPainter::~QPainter((QPainter *)in_stack_fffffffffffffea0);
  local_70.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_70.d.ptr = (QStaticTextItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_70.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1247ced::DrawTextItemDevice::items
            ((DrawTextItemDevice *)in_stack_fffffffffffffe98);
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (QFixedPoint *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1247ced::DrawTextItemDevice::positions
            ((DrawTextItemDevice *)in_stack_fffffffffffffe98);
  local_a0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a0.d.ptr = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  local_a0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1247ced::DrawTextItemDevice::glyphs
            ((DrawTextItemDevice *)in_stack_fffffffffffffe98);
  qVar6 = QList<QStaticTextItem>::size(&local_70);
  this->itemCount = (int)qVar6;
  uVar7 = (ulong)this->itemCount;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar8 = SUB168(auVar2 * ZEXT816(0x50),0);
  uVar12 = uVar8 + 8;
  if (SUB168(auVar2 * ZEXT816(0x50),8) != 0 || 0xfffffffffffffff7 < uVar8) {
    uVar12 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar12);
  *puVar9 = uVar7;
  pQVar13 = (QStaticTextItem *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_108 = pQVar13;
    do {
      QStaticTextItem::QStaticTextItem(in_stack_fffffffffffffea0);
      local_108 = local_108 + 1;
    } while (local_108 != pQVar13 + uVar7);
  }
  this->items = pQVar13;
  uVar7 = QList<unsigned_int>::size(&local_a0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  uVar7 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pgVar10 = (glyph_t *)operator_new__(uVar7);
  this->glyphPool = pgVar10;
  pgVar10 = this->glyphPool;
  __src = QList<unsigned_int>::constData((QList<unsigned_int> *)0x7936fe);
  qVar6 = QList<unsigned_int>::size(&local_a0);
  memcpy(pgVar10,__src,qVar6 << 2);
  uVar7 = QList<QFixedPoint>::size(&local_88);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar8 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pQVar11 = (QFixedPoint *)operator_new__(uVar8);
  pQVar15 = pQVar11;
  if (uVar7 != 0) {
    pQVar14 = pQVar11 + uVar7;
    do {
      QFixedPoint::QFixedPoint((QFixedPoint *)in_stack_fffffffffffffea0);
      pQVar11 = pQVar11 + 1;
    } while (pQVar11 != pQVar14);
  }
  this->positionPool = pQVar15;
  pQVar13 = (QStaticTextItem *)this->positionPool;
  __src_00 = QList<QFixedPoint>::constData((QList<QFixedPoint> *)0x7937de);
  qVar6 = QList<QFixedPoint>::size(&local_88);
  memcpy(pQVar13,__src_00,qVar6 << 3);
  for (local_ac = 0; local_ac < this->itemCount; local_ac = local_ac + 1) {
    QList<QStaticTextItem>::at
              ((QList<QStaticTextItem> *)pQVar13,(qsizetype)in_stack_fffffffffffffe98);
    QStaticTextItem::operator=(pQVar13,in_stack_fffffffffffffe98);
    this->items[local_ac].field_1.glyphs =
         this->glyphPool + this->items[local_ac].field_1.glyphOffset;
    this->items[local_ac].field_0.glyphPositions =
         this->positionPool + this->items[local_ac].field_0.positionOffset;
  }
  this->field_0xe0 = this->field_0xe0 & 0xfe;
  QList<unsigned_int>::~QList((QList<unsigned_int> *)0x79392b);
  QList<QFixedPoint>::~QList((QList<QFixedPoint> *)0x793938);
  QList<QStaticTextItem>::~QList((QList<QStaticTextItem> *)0x793945);
  anon_unknown.dwarf_1247ced::DrawTextItemDevice::~DrawTextItemDevice((DrawTextItemDevice *)pQVar13)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QStaticTextPrivate::init()
{
    delete[] items;
    delete[] glyphPool;
    delete[] positionPool;

    position = QPointF(0, 0);

    DrawTextItemDevice device(untransformedCoordinates, useBackendOptimizations);
    {
        QPainter painter(&device);
        painter.setFont(font);
        painter.setTransform(matrix);

        paintText(QPointF(0, 0), &painter, QColor(0, 0, 0, 0));
    }

    QList<QStaticTextItem> deviceItems = device.items();
    QList<QFixedPoint> positions = device.positions();
    QList<glyph_t> glyphs = device.glyphs();

    itemCount = deviceItems.size();
    items = new QStaticTextItem[itemCount];

    glyphPool = new glyph_t[glyphs.size()];
    memcpy(glyphPool, glyphs.constData(), glyphs.size() * sizeof(glyph_t));

    positionPool = new QFixedPoint[positions.size()];
    memcpy(positionPool, positions.constData(), positions.size() * sizeof(QFixedPoint));

    for (int i=0; i<itemCount; ++i) {
        items[i] = deviceItems.at(i);

        items[i].glyphs = glyphPool + items[i].glyphOffset;
        items[i].glyphPositions = positionPool + items[i].positionOffset;
    }

    needsRelayout = false;
}